

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9ReachN(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAig;
  char *pcVar3;
  char *local_c8;
  char *pcStack_b0;
  int c;
  char *pLogFileName;
  Aig_Man_t *pMan;
  Gia_ParLlb_t *pPars;
  Gia_ParLlb_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pcStack_b0 = (char *)0x0;
  Pars._104_8_ = argv;
  Llb_ManSetDefaultParams((Gia_ParLlb_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_002ba2c2:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars._104_8_,"BFTLryzvwh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9ReachN(): There is no AIG.\n");
        return 1;
      }
      iVar1 = Gia_ManRegNum(pAbc->pGia);
      if (iVar1 == 0) {
        Abc_Print(-1,"Abc_CommandAbc9ReachN(): The current AIG has no latches.\n");
        return 0;
      }
      iVar1 = Gia_ManObjNum(pAbc->pGia);
      if (0xffff < iVar1) {
        Abc_Print(-1,
                  "Abc_CommandAbc9ReachN(): Currently cannot handle AIGs with more than %d objects.\n"
                  ,0x10000);
        return 0;
      }
      pAig = Gia_ManToAigSimple(pAbc->pGia);
      iVar1 = Llb_NonlinCoreReach(pAig,(Gia_ParLlb_t *)&pPars);
      pAbc->Status = iVar1;
      pAbc->nFrames = (int)Pars.TimeTarget;
      Abc_FrameReplaceCex(pAbc,&pAig->pSeqModel);
      if (pcStack_b0 != (char *)0x0) {
        Abc_NtkWriteLogFile(pcStack_b0,pAbc->pCex,pAbc->Status,pAbc->nFrames,"&reachn");
      }
      Aig_ManStop(pAig);
      return 0;
    }
    switch(iVar1) {
    case 0x42:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-B\" should be followed by an integer.\n");
        goto LAB_002ba683;
      }
      pPars._0_4_ = atoi(*(char **)(Pars._104_8_ + (long)globalUtilOptind * 8));
      uVar2 = (uint)pPars;
      break;
    default:
      goto LAB_002ba683;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_002ba683;
      }
      pPars._4_4_ = atoi(*(char **)(Pars._104_8_ + (long)globalUtilOptind * 8));
      uVar2 = pPars._4_4_;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by a file name.\n");
        goto LAB_002ba683;
      }
      pcStack_b0 = *(char **)(Pars._104_8_ + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002ba2c2;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002ba683;
      }
      Pars.fSkipReach = atoi(*(char **)(Pars._104_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.fSkipReach;
      break;
    case 0x68:
      goto LAB_002ba683;
    case 0x72:
      Pars.nPartValue = Pars.nPartValue ^ 1;
      goto LAB_002ba2c2;
    case 0x76:
      Pars.fSchedule = Pars.fSchedule ^ 1;
      goto LAB_002ba2c2;
    case 0x77:
      Pars.fDumpReached = Pars.fDumpReached ^ 1;
      goto LAB_002ba2c2;
    case 0x79:
      Pars.fSilent = Pars.fSilent ^ 1;
      goto LAB_002ba2c2;
    case 0x7a:
      Pars.fVeryVerbose = Pars.fVeryVerbose ^ 1;
      goto LAB_002ba2c2;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_002ba683:
      Abc_Print(-2,"usage: &reachn [-BFT num] [-L file] [-ryzvh]\n");
      Abc_Print(-2,"\t         model checking via BDD-based reachability (non-linear-QS-based)\n");
      Abc_Print(-2,"\t-B num : the BDD node increase when hints kick in [default = %d]\n",
                (ulong)(uint)pPars);
      Abc_Print(-2,"\t-F num : max number of reachability iterations [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n",
                (ulong)(uint)Pars.fSkipReach);
      if (pcStack_b0 == (char *)0x0) {
        local_c8 = "no logging";
      }
      else {
        local_c8 = pcStack_b0;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",local_c8);
      pcVar3 = "no";
      if (Pars.nPartValue != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r     : enable additional BDD var reordering before image [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (Pars.fSilent != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-y     : skip checking property outputs [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fVeryVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-z     : skip reachability (run preparation phase only) [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (Pars.fSchedule != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9ReachN( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Gia_ParLlb_t Pars, * pPars = &Pars;
    Aig_Man_t * pMan;
    char * pLogFileName = NULL;
    int c;
    extern int Llb_NonlinCoreReach( Aig_Man_t * pAig, Gia_ParLlb_t * pPars );

    // set defaults
    Llb_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "BFTLryzvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBddMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBddMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'r':
            pPars->fReorder ^= 1;
            break;
        case 'y':
            pPars->fSkipOutCheck ^= 1;
            break;
        case 'z':
            pPars->fSkipReach ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachN(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachN(): The current AIG has no latches.\n" );
        return 0;
    }
    if ( Gia_ManObjNum(pAbc->pGia) >= (1<<16) )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachN(): Currently cannot handle AIGs with more than %d objects.\n", (1<<16) );
        return 0;
    }
    pMan          = Gia_ManToAigSimple( pAbc->pGia );
    pAbc->Status  = Llb_NonlinCoreReach( pMan, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pMan->pSeqModel );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "&reachn" );
    Aig_ManStop( pMan );
    return 0;

usage:
    Abc_Print( -2, "usage: &reachn [-BFT num] [-L file] [-ryzvh]\n" );
    Abc_Print( -2, "\t         model checking via BDD-based reachability (non-linear-QS-based)\n" );
    Abc_Print( -2, "\t-B num : the BDD node increase when hints kick in [default = %d]\n", pPars->nBddMax );
    Abc_Print( -2, "\t-F num : max number of reachability iterations [default = %d]\n", pPars->nIterMax );
    Abc_Print( -2, "\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-r     : enable additional BDD var reordering before image [default = %s]\n", pPars->fReorder? "yes": "no" );
    Abc_Print( -2, "\t-y     : skip checking property outputs [default = %s]\n", pPars->fSkipOutCheck? "yes": "no" );
    Abc_Print( -2, "\t-z     : skip reachability (run preparation phase only) [default = %s]\n", pPars->fSkipReach? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
//    Abc_Print( -2, "\t-w     : prints additional information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}